

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

Gia_Man_t * Gia_ManPerformMappingInt(Gia_Man_t *p,If_Par_t *pPars)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  If_Par_t *pIVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  If_Man_t *pIfMan;
  If_DsdMan_t *pIVar9;
  Tim_Man_t *pTVar10;
  long lVar11;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Vec_Ptr_t *pVVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  uint uVar18;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                  ,0x8d8,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (pPars->pTimesReq != (float *)0x0) {
    __assert_fail("pPars->pTimesReq == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                  ,0x8d9,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  pVVar12 = p->vCiArrs;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    uVar18 = pVVar12->nSize;
    uVar2 = p->vCis->nSize;
    if (uVar18 != uVar2) {
      __assert_fail("Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x8dc,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    pfVar8 = (float *)calloc((long)(int)uVar2,4);
    pPars->pTimesArr = pfVar8;
    if (0 < (int)uVar18) {
      piVar13 = pVVar12->pArray;
      uVar17 = 0;
      do {
        pfVar8[uVar17] = (float)piVar13[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
  }
  pVVar12 = p->vCoReqs;
  if (pVVar12 != (Vec_Int_t *)0x0) {
    uVar18 = pVVar12->nSize;
    uVar2 = p->vCos->nSize;
    if (uVar18 != uVar2) {
      __assert_fail("Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x8ec,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    pfVar8 = (float *)calloc((long)(int)uVar2,4);
    pPars->pTimesReq = pfVar8;
    if (0 < (int)uVar18) {
      piVar13 = pVVar12->pArray;
      uVar17 = 0;
      do {
        pfVar8[uVar17] = (float)piVar13[uVar17];
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
  }
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  if (p->vConfigs != (Vec_Int_t *)0x0) {
    piVar13 = p->vConfigs->pArray;
    if (piVar13 != (int *)0x0) {
      free(piVar13);
      p->vConfigs->pArray = (int *)0x0;
    }
    if (p->vConfigs != (Vec_Int_t *)0x0) {
      free(p->vConfigs);
      p->vConfigs = (Vec_Int_t *)0x0;
    }
  }
  if ((((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
       ((pPars->fUserRecLib == 0 && (pPars->fUserSesLib == 0)))) &&
      ((pPars->fDeriveLuts == 0 && ((pPars->fUseDsd == 0 && (pPars->fUseTtPerm == 0)))))) &&
     (pPars->pFuncCell2 == (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
    pPars->fCutMin = 0;
  }
  pIfMan = Gia_ManToIf(p,pPars);
  if (pIfMan != (If_Man_t *)0x0) {
    if (pPars->fUseDsd != 0) {
      pIVar9 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      iVar7 = pPars->nLutSize;
      iVar6 = If_DsdManVarNum(pIVar9);
      if (iVar6 < iVar7) {
        __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x907,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      if (((pPars->pLutStruct != (char *)0x0) || (iVar7 = If_DsdManLutSize(pIVar9), iVar7 != 0)) &&
         ((pPars->pLutStruct == (char *)0x0 ||
          (cVar1 = *pPars->pLutStruct, iVar7 = If_DsdManLutSize(pIVar9), cVar1 + -0x30 != iVar7))))
      {
        __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x908,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      pIVar9 = (If_DsdMan_t *)Abc_FrameReadManDsd();
      pIfMan->pIfDsdMan = pIVar9;
      if (pPars->fDsdBalance != 0) {
        If_DsdManAllocIsops(pIVar9,pPars->nLutSize);
      }
    }
    if (pPars->fPower != 0) {
      if (p->pManTime == (void *)0x0) {
        If_ManComputeSwitching(pIfMan);
      }
      else {
        Abc_Print(0,"Switching activity computation for designs with boxes is disabled.\n");
      }
    }
    if (pPars->pReoMan != (void *)0x0) {
      pIfMan->pUserMan = pPars->pReoMan;
    }
    if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
      uVar18 = 1;
      if ((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
         (pPars->fUserRecLib == 0)) {
        uVar18 = (uint)(pPars->fUserSesLib != 0);
      }
      pTVar10 = Tim_ManDup((Tim_Man_t *)p->pManTime,uVar18);
      pIfMan->pManTim = pTVar10;
    }
    if (p->vCoAttrs != (Vec_Int_t *)0x0) {
      if (pIfMan->nObjs[3] != p->vCoAttrs->nSize) {
        __assert_fail("If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                      ,0x91c,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
      }
      pVVar12 = p->vCoAttrs;
      if (0 < pVVar12->nSize) {
        lVar11 = 0;
        do {
          if (pIfMan->vCos->nSize <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          puVar3 = *(uint **)((long)pIfMan->vCos->pArray[lVar11] + 0x18);
          *puVar3 = *puVar3 & 0xfffffbff | (uint)(pVVar12->pArray[lVar11] != 0) << 10;
          lVar11 = lVar11 + 1;
          pVVar12 = p->vCoAttrs;
        } while (lVar11 < pVVar12->nSize);
      }
    }
    iVar7 = If_ManPerformMapping(pIfMan);
    if (iVar7 != 0) {
      if (pPars->pFuncWrite != (_func_int_If_Man_t_ptr *)0x0) {
        (*pPars->pFuncWrite)(pIfMan);
      }
      pIVar4 = pIfMan->pPars;
      if (((pIVar4->fDelayOpt == 0) && (pIVar4->fDsdBalance == 0)) &&
         ((pIVar4->fUserRecLib == 0 && (pIVar4->fUserSesLib == 0)))) {
        p_00 = Gia_ManFromIfLogic(pIfMan);
      }
      else {
        p_00 = Gia_ManFromIfAig(pIfMan);
      }
      if ((p->vCiArrs != (Vec_Int_t *)0x0) || (p->vCoReqs != (Vec_Int_t *)0x0)) {
        if (p->vCoArrs != (Vec_Int_t *)0x0) {
          piVar13 = p->vCoArrs->pArray;
          if (piVar13 != (int *)0x0) {
            free(piVar13);
            p->vCoArrs->pArray = (int *)0x0;
          }
          if (p->vCoArrs != (Vec_Int_t *)0x0) {
            free(p->vCoArrs);
            p->vCoArrs = (Vec_Int_t *)0x0;
          }
        }
        iVar7 = p->vCos->nSize;
        pVVar12 = (Vec_Int_t *)malloc(0x10);
        iVar6 = 0x10;
        if (0xe < iVar7 - 1U) {
          iVar6 = iVar7;
        }
        pVVar12->nSize = 0;
        pVVar12->nCap = iVar6;
        if (iVar6 == 0) {
          piVar13 = (int *)0x0;
        }
        else {
          piVar13 = (int *)malloc((long)iVar6 << 2);
        }
        pVVar12->pArray = piVar13;
        p->vCoArrs = pVVar12;
        pVVar14 = pIfMan->vCos;
        if (0 < pVVar14->nSize) {
          lVar11 = 0;
          do {
            Vec_IntPush(p->vCoArrs,
                        (int)*(float *)(*(long *)((long)pVVar14->pArray[lVar11] + 0x18) + 0x5c));
            lVar11 = lVar11 + 1;
            pVVar14 = pIfMan->vCos;
          } while (lVar11 < pVVar14->nSize);
        }
      }
      If_ManStop(pIfMan);
      if (p_00->pName == (char *)0x0) {
        pcVar5 = p->pName;
        if (pcVar5 == (char *)0x0) {
          pcVar16 = (char *)0x0;
        }
        else {
          sVar15 = strlen(pcVar5);
          pcVar16 = (char *)malloc(sVar15 + 1);
          strcpy(pcVar16,pcVar5);
        }
        p_00->pName = pcVar16;
        pcVar5 = p->pSpec;
        if (pcVar5 == (char *)0x0) {
          pcVar16 = (char *)0x0;
        }
        else {
          sVar15 = strlen(pcVar5);
          pcVar16 = (char *)malloc(sVar15 + 1);
          strcpy(pcVar16,pcVar5);
        }
        p_00->pSpec = pcVar16;
        Gia_ManSetRegNum(p_00,p->nRegs);
        if (pPars->fVerboseTrace == 0) {
          return p_00;
        }
        p_00->pLutLib = pPars->pLutLib;
        Gia_ManDelayTraceLutPrint(p_00,1);
        p_00->pLutLib = (void *)0x0;
        return p_00;
      }
      __assert_fail("pNew->pName == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaIf.c"
                    ,0x936,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    If_ManStop(pIfMan);
  }
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManPerformMappingInt( Gia_Man_t * p, If_Par_t * pPars )
{
    extern void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose );
    Gia_Man_t * pNew;
    If_Man_t * pIfMan; int i, Entry;//, Id, EntryF;
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    if ( p->vCiArrs )
    {
        assert( Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p) );
        Vec_IntForEachEntry( p->vCiArrs, Entry, i )
            pPars->pTimesArr[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vInArrs )
    {
        assert( Vec_FltSize(p->vInArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p));
        Gia_ManForEachCiId( p, Id, i )
            pPars->pTimesArr[i] = Vec_FltEntry(p->vInArrs, i);
    }
*/
    if ( p->vCoReqs )
    {
        assert( Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_IntForEachEntry( p->vCoReqs, Entry, i )
            pPars->pTimesReq[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vOutReqs )
    {
        assert( Vec_FltSize(p->vOutReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_FltForEachEntry( p->vOutReqs, EntryF, i )
            pPars->pTimesReq[i] = EntryF;
    }
*/
    ABC_FREE( p->pCellStr );
    Vec_IntFreeP( &p->vConfigs );
    // disable cut minimization when GIA strucure is needed
    if ( !pPars->fDelayOpt && !pPars->fDelayOptLut && !pPars->fDsdBalance && !pPars->fUserRecLib && !pPars->fUserSesLib && !pPars->fDeriveLuts && !pPars->fUseDsd && !pPars->fUseTtPerm && !pPars->pFuncCell2 )
        pPars->fCutMin = 0;
    // translate into the mapper
    pIfMan = Gia_ManToIf( p, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }
    // compute switching for the IF objects
    if ( pPars->fPower )
    {
        if ( p->pManTime == NULL )
            If_ManComputeSwitching( pIfMan );
        else
            Abc_Print( 0, "Switching activity computation for designs with boxes is disabled.\n" );
    }
    if ( pPars->pReoMan )
        pIfMan->pUserMan = pPars->pReoMan;
    if ( p->pManTime )
        pIfMan->pManTim = Tim_ManDup( (Tim_Man_t *)p->pManTime, pPars->fDelayOpt || pPars->fDelayOptLut || pPars->fDsdBalance || pPars->fUserRecLib || pPars->fUserSesLib );
//    Tim_ManPrint( pIfMan->pManTim );
    if ( p->vCoAttrs )
    {
        assert( If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs) );
        Vec_IntForEachEntry( p->vCoAttrs, Entry, i )
            If_ObjFanin0( If_ManCo(pIfMan, i) )->fSpec = (Entry != 0);
    }
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }
    if ( pPars->pFuncWrite )
        pPars->pFuncWrite( pIfMan );
    // transform the result of mapping into the new network
    if ( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib || pIfMan->pPars->fUserSesLib )
        pNew = Gia_ManFromIfAig( pIfMan );
    else
        pNew = Gia_ManFromIfLogic( pIfMan );
    if ( p->vCiArrs || p->vCoReqs )
    {
        If_Obj_t * pIfObj = NULL;
        Vec_IntFreeP( &p->vCoArrs );
        p->vCoArrs = Vec_IntAlloc( Gia_ManCoNum(p) );
        If_ManForEachCo( pIfMan, pIfObj, i )
            Vec_IntPush( p->vCoArrs, (int)If_ObjArrTime(If_ObjFanin0(pIfObj)) );
    }
    If_ManStop( pIfMan );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // print delay trace
    if ( pPars->fVerboseTrace )
    {
        pNew->pLutLib = pPars->pLutLib;
        Gia_ManDelayTraceLutPrint( pNew, 1 );
        pNew->pLutLib = NULL;
    }
    return pNew;
}